

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask1_16(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 1 | *out;
  *out = in[2] << 2 | *out;
  *out = in[3] << 3 | *out;
  *out = in[4] << 4 | *out;
  *out = in[5] << 5 | *out;
  *out = in[6] << 6 | *out;
  *out = in[7] << 7 | *out;
  *out = in[8] << 8 | *out;
  *out = in[9] << 9 | *out;
  *out = in[10] << 10 | *out;
  *out = in[0xb] << 0xb | *out;
  *out = in[0xc] << 0xc | *out;
  *out = in[0xd] << 0xd | *out;
  *out = in[0xe] << 0xe | *out;
  *out = in[0xf] << 0xf | *out;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 15;
  ++in;

  return out + 1;
}